

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

nghttp2_stream_proto_state nghttp2_stream_get_state(nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  
  if ((stream->flags & 2) != 0) {
    return NGHTTP2_STREAM_STATE_CLOSED;
  }
  if ((stream->flags & 1) != 0) {
    if ((stream->shut_flags & 1) != 0) {
      return NGHTTP2_STREAM_STATE_RESERVED_LOCAL;
    }
    if ((stream->shut_flags & 2) != 0) {
      return NGHTTP2_STREAM_STATE_RESERVED_REMOTE;
    }
  }
  if ((stream->shut_flags & 1) == 0) {
    if ((stream->shut_flags & 2) == 0) {
      if (stream->state == NGHTTP2_STREAM_IDLE) {
        stream_local._4_4_ = NGHTTP2_STREAM_STATE_IDLE;
      }
      else {
        stream_local._4_4_ = NGHTTP2_STREAM_STATE_OPEN;
      }
    }
    else {
      stream_local._4_4_ = NGHTTP2_STREAM_STATE_HALF_CLOSED_LOCAL;
    }
  }
  else {
    stream_local._4_4_ = NGHTTP2_STREAM_STATE_HALF_CLOSED_REMOTE;
  }
  return stream_local._4_4_;
}

Assistant:

nghttp2_stream_proto_state nghttp2_stream_get_state(nghttp2_stream *stream) {
  if (stream->flags & NGHTTP2_STREAM_FLAG_CLOSED) {
    return NGHTTP2_STREAM_STATE_CLOSED;
  }

  if (stream->flags & NGHTTP2_STREAM_FLAG_PUSH) {
    if (stream->shut_flags & NGHTTP2_SHUT_RD) {
      return NGHTTP2_STREAM_STATE_RESERVED_LOCAL;
    }

    if (stream->shut_flags & NGHTTP2_SHUT_WR) {
      return NGHTTP2_STREAM_STATE_RESERVED_REMOTE;
    }
  }

  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    return NGHTTP2_STREAM_STATE_HALF_CLOSED_REMOTE;
  }

  if (stream->shut_flags & NGHTTP2_SHUT_WR) {
    return NGHTTP2_STREAM_STATE_HALF_CLOSED_LOCAL;
  }

  if (stream->state == NGHTTP2_STREAM_IDLE) {
    return NGHTTP2_STREAM_STATE_IDLE;
  }

  return NGHTTP2_STREAM_STATE_OPEN;
}